

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void GF2::Env::Trace(char *format,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_d8;
  void **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (*format != '\0') {
    local_c8 = local_b8;
    local_d0 = &args[0].overflow_arg_area;
    local_d8 = 0x3000000008;
    vsnprintf(Trace::buf,0x400,format,&local_d8);
    iVar1 = strcmp(Trace::prevbuf,Trace::buf);
    if (iVar1 != 0) {
      printf("\x1b[0K");
      printf("\x1b[32m%s\x1b[0m",Trace::buf);
      sVar2 = strlen(Trace::buf);
      printf("\x1b[%dD",sVar2 & 0xffffffff);
      strcpy(Trace::prevbuf,Trace::buf);
    }
    return;
  }
  Trace::prevbuf[0] = '\0';
  printf("\x1b[0K");
  return;
}

Assistant:

void Env::Trace(const char* format,...)
{	
	static char prevbuf[1024];
	static char buf[1024];
	// пустая форматная строка?
	if (::strlen(format) == 0)
	{
		prevbuf[0] = '\0';
#ifdef OS_WIN
		::SetConsoleTitleA(Name());
#elif defined OS_UNIX
		// clear line from cursor right
		// [http://www.climagic.org/mirrors/VT100_Escape_Codes.html]
		printf("\033[0K");
#endif
		return;
	}
	// сообщение
	va_list args;
	va_start(args, format);
	::vsnprintf(buf, sizeof(buf), format, args);
	va_end(args);
#if defined OS_WIN
	::CharToOemA(buf, (char*)buf);
#endif
	if (::strcmp(prevbuf, buf))
	{
#if defined OS_WIN
		::SetConsoleTitleA(buf);
#elif defined OS_UNIX
		// clear line from cursor right
		printf("\033[0K");
		// print in green 
		// [ANSI_COLOR_GREEN = "\x1b[32m", ANSI_COLOR_RESET = "\x1b[0m"]
		printf("\x1b[32m%s\x1b[0m", buf);
		// move cursor backward
		printf("\033[%dD", (int)strlen(buf));
#else
		fprintf(stderr, "%s ", buf);
#endif
		::strcpy(prevbuf, buf);
	}
}